

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLint GVar8;
  time_t tVar9;
  GLFWmonitor **ppGVar10;
  GLFWvidmode *pGVar11;
  GLFWwindow *handle;
  char *pcVar12;
  vec4 *pafVar13;
  int i;
  long lVar14;
  long lVar15;
  ulong uVar16;
  GLFWmonitor *handle_00;
  int height_00;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int height;
  int width;
  GLuint vertex_buffer;
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  ulong local_100;
  int monitorCount;
  float local_f4;
  float local_f0 [3];
  float local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_cc;
  undefined8 uStack_c4;
  undefined4 local_bc;
  float local_b8;
  float local_b4 [12];
  undefined8 local_84;
  undefined4 local_7c;
  mat4x4 m;
  
  uVar16 = 0;
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
LAB_00115bd3:
    exit(1);
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  do {
    iVar3 = 0x280;
    height_00 = 0x1e0;
    local_100 = uVar16;
    if ((uVar16 & 1) == 0) {
LAB_00115c4b:
      bVar2 = true;
      handle_00 = (GLFWmonitor *)0x0;
    }
    else {
      ppGVar10 = glfwGetMonitors(&monitorCount);
      iVar4 = rand();
      handle_00 = ppGVar10[iVar4 % monitorCount];
      if (handle_00 == (GLFWmonitor *)0x0) goto LAB_00115c4b;
      pGVar11 = glfwGetVideoMode(handle_00);
      iVar3 = pGVar11->width;
      height_00 = pGVar11->height;
      bVar2 = false;
    }
    local_118 = glfwGetTime();
    handle = glfwCreateWindow(iVar3,height_00,"Window Re-opener",handle_00,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00115bd3;
    }
    if (bVar2) {
      dVar1 = glfwGetTime();
      printf("Opening regular window took %0.3f seconds\n",SUB84(dVar1 - local_118,0));
    }
    else {
      pcVar12 = glfwGetMonitorName(handle_00);
      dVar1 = glfwGetTime();
      printf("Opening full screen window on monitor %s took %0.3f seconds\n",
             SUB84(dVar1 - local_118,0),pcVar12);
    }
    glfwSetWindowCloseCallback(handle,window_close_callback);
    glfwSetKeyCallback(handle,key_callback);
    glfwMakeContextCurrent(handle);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);
    GVar5 = (*glad_glCreateShader)(0x8b31);
    (*glad_glShaderSource)(GVar5,1,&vertex_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar5);
    GVar6 = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(GVar6,1,&fragment_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar6);
    GVar7 = (*glad_glCreateProgram)();
    (*glad_glAttachShader)(GVar7,GVar5);
    (*glad_glAttachShader)(GVar7,GVar6);
    (*glad_glLinkProgram)(GVar7);
    GVar8 = (*glad_glGetUniformLocation)(GVar7,"MVP");
    GVar5 = (*glad_glGetAttribLocation)(GVar7,"vPos");
    (*glad_glGenBuffers)(1,&vertex_buffer);
    (*glad_glBindBuffer)(0x8892,vertex_buffer);
    (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
    (*glad_glEnableVertexAttribArray)(GVar5);
    (*glad_glVertexAttribPointer)(GVar5,2,0x1406,'\0',8,(void *)0x0);
    glfwSetTime(0.0);
    while( true ) {
      dVar1 = glfwGetTime();
      uVar18 = 0x40140000;
      uVar19 = 0;
      uVar20 = 0;
      if (5.0 <= dVar1) break;
      glfwGetFramebufferSize(handle,&width,&height);
      local_118 = (double)CONCAT44(uVar18,(float)width / (float)height);
      uStack_110 = uVar19;
      uStack_10c = uVar20;
      (*glad_glViewport)(0,0,width,height);
      (*glad_glClear)(0x4000);
      local_b8 = 2.0 / ((float)local_118 + (float)local_118);
      local_b4[0] = 0.0;
      local_b4[1] = 0.0;
      local_b4[2] = 0.0;
      local_b4[3] = 0.0;
      local_b4[10] = 0.0;
      local_b4[8] = 0.0;
      local_b4[9] = -2.0;
      local_b4[4] = 1.0;
      local_b4[5] = 0.0;
      local_b4[6] = 0.0;
      local_b4[7] = 0.0;
      local_b4[0xb] = -((float)local_118 - (float)local_118) / ((float)local_118 + (float)local_118)
      ;
      local_84 = 0xbf80000080000000;
      local_7c = 0x3f800000;
      pafVar13 = m;
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
          fVar17 = 1.0;
          if (lVar14 != lVar15) {
            fVar17 = 0.0;
          }
          (*pafVar13)[lVar15] = fVar17;
        }
        pafVar13 = pafVar13 + 1;
      }
      dVar1 = glfwGetTime();
      fVar17 = sinf((float)dVar1);
      local_118 = (double)CONCAT44(extraout_XMM0_Db,fVar17);
      monitorCount = (int)cosf((float)dVar1);
      local_f4 = (float)local_118;
      local_f0[0] = 0.0;
      local_f0[1] = 0.0;
      local_f0[2] = -(float)local_118;
      local_e0 = 0;
      uStack_d8 = 0;
      local_d0 = 0x3f800000;
      local_cc = 0;
      uStack_c4 = 0;
      local_bc = 0x3f800000;
      local_e4 = (float)monitorCount;
      mat4x4_mul(m,m,(vec4 *)&monitorCount);
      mat4x4_mul((vec4 *)&monitorCount,(vec4 *)&local_b8,m);
      (*glad_glUseProgram)(GVar7);
      (*glad_glUniformMatrix4fv)(GVar8,1,'\0',(GLfloat *)&monitorCount);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(handle);
      glfwPollEvents();
      iVar3 = glfwWindowShouldClose(handle);
      if (iVar3 != 0) {
        close_window(handle);
        puts("User closed window");
        glfwTerminate();
        exit(0);
      }
    }
    puts("Closing window");
    close_window(handle);
    uVar16 = (ulong)((int)local_100 + 1);
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    double base;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;
        GLuint vertex_shader, fragment_shader, program, vertex_buffer;
        GLint mvp_location, vpos_location;

        if (count & 1)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        base = glfwGetTime();

        window = glfwCreateWindow(width, height, "Window Re-opener", monitor, NULL);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        if (monitor)
        {
            printf("Opening full screen window on monitor %s took %0.3f seconds\n",
                   glfwGetMonitorName(monitor),
                   glfwGetTime() - base);
        }
        else
        {
            printf("Opening regular window took %0.3f seconds\n",
                   glfwGetTime() - base);
        }

        glfwSetWindowCloseCallback(window, window_close_callback);
        glfwSetKeyCallback(window, key_callback);

        glfwMakeContextCurrent(window);
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);

        vertex_shader = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
        glCompileShader(vertex_shader);

        fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
        glCompileShader(fragment_shader);

        program = glCreateProgram();
        glAttachShader(program, vertex_shader);
        glAttachShader(program, fragment_shader);
        glLinkProgram(program);

        mvp_location = glGetUniformLocation(program, "MVP");
        vpos_location = glGetAttribLocation(program, "vPos");

        glGenBuffers(1, &vertex_buffer);
        glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

        glEnableVertexAttribArray(vpos_location);
        glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                              sizeof(vertices[0]), (void*) 0);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            float ratio;
            int width, height;
            mat4x4 m, p, mvp;

            glfwGetFramebufferSize(window, &width, &height);
            ratio = width / (float) height;

            glViewport(0, 0, width, height);
            glClear(GL_COLOR_BUFFER_BIT);

            mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

            mat4x4_identity(m);
            mat4x4_rotate_Z(m, m, (float) glfwGetTime());
            mat4x4_mul(mvp, p, m);

            glUseProgram(program);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
            glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}